

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optCompare_bothEmpty_Test::~optCompare_bothEmpty_Test(optCompare_bothEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, bothEmpty)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i1, i2;
  EXPECT_TRUE(i1 == i2);
  EXPECT_FALSE(i1 != i2);
  EXPECT_FALSE(i1 < i2);
  EXPECT_FALSE(i1 > i2);
  EXPECT_TRUE(i1 <= i2);
  EXPECT_TRUE(i1 >= i2);
}